

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::TraverseSchema::traverseIdentityConstraint
          (TraverseSchema *this,IdentityConstraint *ic,DOMElement *icElem)

{
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  MemoryManager *pMVar4;
  BaseRefVectorOf<xercesc_4_0::IC_Field> *this_00;
  XMLSize_t XVar5;
  XSAnnotation *pXVar6;
  int iVar7;
  XMLSize_t index;
  DOMElement *pDVar8;
  DOMNode *pDVar9;
  XSAnnotation *pXVar10;
  undefined4 extraout_var;
  long *plVar12;
  XMLCh *pXVar13;
  XercesXPath *pXVar14;
  IC_Selector *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IC_Field *this_02;
  RefVectorOf<xercesc_4_0::IC_Field> *pRVar15;
  undefined4 extraout_var_03;
  long lVar16;
  short *psVar17;
  bool bVar18;
  NamespaceScopeManager nsMgr;
  XSAnnotation *local_68;
  NamespaceScopeManager local_40;
  short *psVar11;
  undefined4 extraout_var_00;
  
  pSVar3 = this->fSchemaInfo;
  if (icElem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,icElem);
  }
  local_40.fSchemaInfo = pSVar3;
  pDVar8 = XUtil::getFirstChildElement(&icElem->super_DOMNode);
  pDVar9 = &checkContent(this,icElem,pDVar8,false,true)->super_DOMNode;
  if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
      (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
    pXVar10 = generateSyntheticAnnotation(this,icElem,this->fNonXSAttList);
    this->fAnnotation = pXVar10;
  }
  local_68 = this->fAnnotation;
  if (pDVar9 == (DOMNode *)0x0) {
    bVar18 = false;
    goto LAB_0033bb2b;
  }
  iVar7 = (*pDVar9->_vptr_DOMNode[0x18])(pDVar9);
  psVar11 = (short *)CONCAT44(extraout_var,iVar7);
  if (psVar11 == &SchemaSymbols::fgELT_SELECTOR) {
LAB_0033b55b:
    GeneralAttributeCheck::checkAttributes
              (&this->fAttributeCheck,(DOMElement *)pDVar9,0x29,this,false,this->fNonXSAttList);
    pDVar8 = XUtil::getFirstChildElement(pDVar9);
    pDVar8 = checkContent(this,icElem,pDVar8,true,true);
    if (pDVar8 != (DOMElement *)0x0) {
      reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",0x4d);
    }
    if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
        (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
      pXVar10 = generateSyntheticAnnotation(this,(DOMElement *)pDVar9,this->fNonXSAttList);
      this->fAnnotation = pXVar10;
    }
    pXVar10 = this->fAnnotation;
    pXVar6 = local_68;
    if ((pXVar10 != (XSAnnotation *)0x0) && (pXVar6 = pXVar10, local_68 != (XSAnnotation *)0x0)) {
      XSAnnotation::setNext(local_68,pXVar10);
      pXVar6 = local_68;
    }
    local_68 = pXVar6;
    iVar7 = (*pDVar9->_vptr_DOMNode[0x2a])(pDVar9,SchemaSymbols::fgATT_XPATH);
    plVar12 = (long *)CONCAT44(extraout_var_00,iVar7);
    if (plVar12 == (long *)0x0) {
      pXVar13 = (XMLCh *)0x0;
    }
    else {
      pXVar13 = (XMLCh *)(**(code **)(*plVar12 + 0x150))(plVar12);
    }
    if (pXVar13 == (XMLCh *)0x0) {
      bVar18 = false;
    }
    else {
      lVar16 = 0;
      do {
        psVar11 = (short *)((long)pXVar13 + lVar16);
        lVar16 = lVar16 + 2;
      } while (*psVar11 != 0);
      bVar18 = lVar16 != 2;
    }
    if ((bool)(pXVar13 != (XMLCh *)0x0 & bVar18)) {
      pXVar14 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
      XercesXPath::XercesXPath
                (pXVar14,pXVar13,this->fStringPool,
                 &this->fSchemaInfo->fNamespaceScope->super_XercesNamespaceResolver,
                 this->fEmptyNamespaceURI,true,this->fGrammarPoolMemoryManager);
      this_01 = (IC_Selector *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
      IC_Selector::IC_Selector(this_01,pXVar14,ic);
      IdentityConstraint::setSelector(ic,this_01);
      pDVar9 = &XUtil::getNextSiblingElement(pDVar9)->super_DOMNode;
      if (pDVar9 == (DOMNode *)0x0) {
        reportSchemaError(this,icElem,L"http://apache.org/xml/messages/XMLErrors",0x83);
      }
      else {
        for (; pXVar10 = local_68, pDVar9 != (DOMNode *)0x0;
            pDVar9 = &XUtil::getNextSiblingElement(pDVar9)->super_DOMNode) {
          iVar7 = (*pDVar9->_vptr_DOMNode[0x18])(pDVar9);
          psVar11 = (short *)CONCAT44(extraout_var_01,iVar7);
          if (psVar11 == &SchemaSymbols::fgELT_FIELD) {
LAB_0033b795:
            GeneralAttributeCheck::checkAttributes
                      (&this->fAttributeCheck,(DOMElement *)pDVar9,0x14,this,false,
                       this->fNonXSAttList);
            pDVar8 = XUtil::getFirstChildElement(pDVar9);
            pDVar8 = checkContent(this,icElem,pDVar8,true,true);
            if (pDVar8 != (DOMElement *)0x0) {
              reportSchemaError(this,(DOMElement *)pDVar9,
                                L"http://apache.org/xml/messages/XMLErrors",0x4d);
            }
            if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
                (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)
               ) {
              pXVar10 = generateSyntheticAnnotation(this,(DOMElement *)pDVar9,this->fNonXSAttList);
              this->fAnnotation = pXVar10;
            }
            pXVar10 = this->fAnnotation;
            pXVar6 = local_68;
            if ((pXVar10 != (XSAnnotation *)0x0) &&
               (pXVar6 = pXVar10, local_68 != (XSAnnotation *)0x0)) {
              XSAnnotation::setNext(local_68,pXVar10);
              pXVar6 = local_68;
            }
            local_68 = pXVar6;
            iVar7 = (*pDVar9->_vptr_DOMNode[0x2a])(pDVar9,SchemaSymbols::fgATT_XPATH);
            plVar12 = (long *)CONCAT44(extraout_var_02,iVar7);
            if (plVar12 == (long *)0x0) {
              pXVar13 = (XMLCh *)0x0;
            }
            else {
              pXVar13 = (XMLCh *)(**(code **)(*plVar12 + 0x150))(plVar12);
            }
            if ((pXVar13 == (XMLCh *)0x0) || (*pXVar13 == L'\0')) {
              reportSchemaError(this,(DOMElement *)pDVar9,
                                L"http://apache.org/xml/messages/XMLErrors",0x86);
              goto LAB_0033bb24;
            }
            pXVar14 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
            XercesXPath::XercesXPath
                      (pXVar14,pXVar13,this->fStringPool,
                       &this->fSchemaInfo->fNamespaceScope->super_XercesNamespaceResolver,
                       this->fEmptyNamespaceURI,false,this->fGrammarPoolMemoryManager);
            this_02 = (IC_Field *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
            IC_Field::IC_Field(this_02,pXVar14,ic);
            if (ic->fFields == (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) {
              pRVar15 = (RefVectorOf<xercesc_4_0::IC_Field> *)
                        XMemory::operator_new(0x30,ic->fMemoryManager);
              pMVar4 = ic->fMemoryManager;
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>)._vptr_BaseRefVectorOf =
                   (_func_int **)&PTR__BaseRefVectorOf_00416248;
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fAdoptedElems = true;
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount = 0;
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fMaxCount = 4;
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fElemList = (IC_Field **)0x0;
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fMemoryManager = pMVar4;
              iVar7 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,0x20);
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fElemList =
                   (IC_Field **)CONCAT44(extraout_var_03,iVar7);
              lVar16 = 0;
              do {
                (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fElemList[lVar16] =
                     (IC_Field *)0x0;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              (pRVar15->super_BaseRefVectorOf<xercesc_4_0::IC_Field>)._vptr_BaseRefVectorOf =
                   (_func_int **)&PTR__RefVectorOf_004161d0;
              ic->fFields = pRVar15;
            }
            this_00 = &ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>;
            BaseRefVectorOf<xercesc_4_0::IC_Field>::ensureExtraCapacity(this_00,1);
            XVar5 = this_00->fCurCount;
            this_00->fElemList[XVar5] = this_02;
            this_00->fCurCount = XVar5 + 1;
          }
          else {
            psVar17 = &SchemaSymbols::fgELT_FIELD;
            if (psVar11 == (short *)0x0) {
LAB_0033b773:
              if (*psVar17 == 0) goto LAB_0033b795;
            }
            else {
              do {
                sVar1 = *psVar11;
                if (sVar1 == 0) goto LAB_0033b773;
                psVar11 = psVar11 + 1;
                sVar2 = *psVar17;
                psVar17 = psVar17 + 1;
              } while (sVar1 == sVar2);
            }
            reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",
                              0x83);
          }
        }
        if (local_68 != (XSAnnotation *)0x0) {
          local_68 = (XSAnnotation *)0x0;
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,ic,pXVar10);
        }
        if (ic->fFields != (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) {
          bVar18 = (ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount != 0;
          goto LAB_0033bb2b;
        }
      }
    }
    else {
      reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",0x86);
    }
  }
  else {
    psVar17 = &SchemaSymbols::fgELT_SELECTOR;
    if (psVar11 == (short *)0x0) {
LAB_0033b539:
      if (*psVar17 == 0) goto LAB_0033b55b;
    }
    else {
      do {
        sVar1 = *psVar11;
        if (sVar1 == 0) goto LAB_0033b539;
        psVar11 = psVar11 + 1;
        sVar2 = *psVar17;
        psVar17 = psVar17 + 1;
      } while (sVar1 == sVar2);
    }
    reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",0x83);
  }
LAB_0033bb24:
  bVar18 = false;
LAB_0033bb2b:
  if (local_68 != (XSAnnotation *)0x0) {
    (*(local_68->super_XSerializable)._vptr_XSerializable[1])();
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return bVar18;
}

Assistant:

bool TraverseSchema::traverseIdentityConstraint(IdentityConstraint* const ic,
                                                const DOMElement* const icElem) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    DOMElement* elem = checkContent(icElem, XUtil::getFirstChildElement(icElem), false);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(icElem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Get selector
    // ------------------------------------------------------------------
    if (elem == 0) {

//        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_SELECTOR)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Selector, this, false, fNonXSAttList
    );
    if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    if (fAnnotation)
    {
        if (janAnnot.isDataNull())
            janAnnot.reset(fAnnotation);
        else
            janAnnot.get()->setNext(fAnnotation);
    }

    // ------------------------------------------------------------------
    // Get xpath attribute
    // ------------------------------------------------------------------
    const XMLCh* xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);
    XMLSize_t    xpathLen = XMLString::stringLen(xpathExpr);

    if (!xpathExpr || !xpathLen) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
        return false;
    }

    // ------------------------------------------------------------------
    // Parse xpath expression
    // ------------------------------------------------------------------
    try {

        XercesXPath* sXPath = new (fGrammarPoolMemoryManager) XercesXPath(xpathExpr, fStringPool, fSchemaInfo->getNamespaceScope(), fEmptyNamespaceURI, true, fGrammarPoolMemoryManager);
        IC_Selector* icSelector = new (fGrammarPoolMemoryManager) IC_Selector(sXPath, ic);
        ic->setSelector(icSelector);
    }
    catch (const XPathException& e) {

        reportSchemaError(elem, e);
        return false;
    }

    // ------------------------------------------------------------------
    // Get fields
    // ------------------------------------------------------------------
    elem = XUtil::getNextSiblingElement(elem);

    if (elem == 0) {

        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    while (elem != 0) {

        if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_FIELD)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        }
        else {
            // General Attribute Checking
            fAttributeCheck.checkAttributes(
                elem, GeneralAttributeCheck::E_Field, this, false, fNonXSAttList
            );
            if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
            if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
            {
                fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
            }
            if (fAnnotation)
            {
                if (janAnnot.isDataNull())
                    janAnnot.reset(fAnnotation);
                else
                    janAnnot.get()->setNext(fAnnotation);
            }

            // xpath expression parsing
            xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);

            if (!xpathExpr || !*xpathExpr) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
                return false;
            }

            try {

                XercesXPath* fieldXPath = new (fGrammarPoolMemoryManager) XercesXPath
                (
                    xpathExpr
                    , fStringPool
                    , fSchemaInfo->getNamespaceScope()
                    , fEmptyNamespaceURI
                    , false
                    , fGrammarPoolMemoryManager
                );
                IC_Field* icField = new (fGrammarPoolMemoryManager) IC_Field(fieldXPath, ic);
                ic->addField(icField);
            }
            catch (const XPathException& e) {

                reportSchemaError(elem, e);
                return false;
            }
        }

        elem = XUtil::getNextSiblingElement(elem);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(ic, janAnnot.release());

    if (ic->getFieldCount() == 0) {
        return false;
    }

    return true;
}